

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

uint16_t calc_crc(uint8_t *payload,uint16_t length)

{
  int local_18;
  uint16_t local_14;
  int i;
  uint16_t crc;
  uint16_t length_local;
  uint8_t *payload_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < (int)(uint)length; local_18 = local_18 + 1) {
    local_14 = __calc_crc(payload[local_18],local_14);
  }
  return local_14;
}

Assistant:

static uint16_t calc_crc(const uint8_t *payload, uint16_t length)
{
    uint16_t crc = 0;
    for(int i = 0;i < length;i++) {
        crc = __calc_crc(payload[i], crc);
    }
    return crc;
}